

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

void __thiscall
Parser::printError<std::__cxx11::string>
          (Parser *this,Token *token,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  size_t sVar1;
  string_view text_00;
  string local_38;
  
  tinyformat::format<std::__cxx11::string>(&local_38,(tinyformat *)text,(char *)args,args);
  sVar1 = token->line;
  this->errorLine = sVar1;
  Global.FileInfo.LineNumber = (int)sVar1;
  text_00._M_str = (char *)&Global;
  text_00._M_len = (size_t)local_38._M_dataplus._M_p;
  Logger::printError((Logger *)0x1,(ErrorType)local_38._M_string_length,text_00);
  this->error = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}